

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O0

string * __thiscall
Pipeline::getIdentifier_abi_cxx11_(string *__return_storage_ptr__,Pipeline *this)

{
  Pipeline *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->identifier);
  return __return_storage_ptr__;
}

Assistant:

std::string
Pipeline::getIdentifier() const
{
    return this->identifier;
}